

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSlowShrinking.cpp
# Opt level: O3

int main(void)

{
  undefined4 in_stack_ffffffffffffff6c;
  SeedType in_stack_ffffffffffffff70;
  __uniq_ptr_impl<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>,_std::default_delete<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
  local_88;
  undefined **local_80;
  long *local_78;
  ulong uStack_70;
  Result local_68;
  
  local_78 = (long *)0x0;
  uStack_70 = 0;
  local_88._M_t.
  super__Tuple_impl<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_std::default_delete<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
  .
  super__Head_base<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_false>
  ._M_head_impl =
       (tuple<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_std::default_delete<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
        )operator_new(0x10);
  *(undefined ***)
   local_88._M_t.
   super__Tuple_impl<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_std::default_delete<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
   .
   super__Head_base<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_false>
   ._M_head_impl = &PTR__GenConcept_0010ebc8;
  local_80 = &PTR_expect_0010ed08;
  cppqc::tupleOf<std::vector<int,std::allocator<int>>>
            ((cppqc *)&local_78,(Generator<std::vector<int,_std::allocator<int>_>_> *)&local_88);
  if ((_Tuple_impl<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_std::default_delete<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
       )local_88._M_t.
        super__Tuple_impl<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_std::default_delete<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
        .
        super__Head_base<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_false>
        ._M_head_impl != (GenConcept<std::vector<int,_std::allocator<int>_>_> *)0x0) {
    (**(code **)(*(long *)local_88._M_t.
                          super__Tuple_impl<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_std::default_delete<cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
                          .
                          super__Head_base<0UL,_cppqc::detail::GenConcept<std::vector<int,_std::allocator<int>_>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  local_80 = &PTR_expect_0010eb40;
  uStack_70 = uStack_70 & 0xffffffffffffff00;
  cppqc::
  quickCheckOutput<std::vector<int,std::allocator<int>>,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type,cppqc::detail::null_type>
            (&local_68,(cppqc *)&local_80,
             (Property<std::vector<int,_std::allocator<int>_>,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type,_cppqc::detail::null_type>
              *)&std::cout,(ostream *)0x64,0,0,CONCAT44(in_stack_ffffffffffffff6c,0xffffffff),
             (duration<double,_std::ratio<1L,_1L>_>)0x403e000000000000,in_stack_ffffffffffffff70);
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_68.labels._M_t);
  local_80 = &PTR_expect_0010ed08;
  if (local_78 != (long *)0x0) {
    (**(code **)(*local_78 + 8))();
  }
  return 0;
}

Assistant:

int main() {
  cppqc::quickCheckOutput(PropTestSlowFunction());
}